

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::solveLleft(CLUFactor<double> *this,double *vec)

{
  double dVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  long lVar5;
  long in_RSI;
  long in_RDI;
  int j;
  int k;
  double x;
  int r;
  int i;
  undefined4 local_24;
  undefined4 local_14;
  
  local_14 = *(int *)(in_RDI + 4);
  while (local_14 = local_14 + -1, -1 < local_14) {
    iVar2 = *(int *)(*(long *)(in_RDI + 0xd0) + (long)local_14 * 4);
    dVar1 = *(double *)(in_RSI + (long)iVar2 * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      for (local_24 = *(int *)(*(long *)(in_RDI + 200) + (long)iVar2 * 4);
          local_24 < *(int *)(*(long *)(in_RDI + 200) + (long)(iVar2 + 1) * 4);
          local_24 = local_24 + 1) {
        iVar3 = *(int *)(*(long *)(in_RDI + 0xc0) + (long)local_24 * 4);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xa8),
                            (long)local_24);
        lVar5 = (long)iVar3;
        *(double *)(in_RSI + lVar5 * 8) = *(double *)(in_RSI + lVar5 * 8) - dVar1 * *pvVar4;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleft(R* vec) const
{

#ifndef SOPLEX_WITH_L_ROWS
   int*  idx;
   R* val;
   R* lval  = l.val.data();
   int*  lidx  = l.idx;
   int*  lrow  = l.row;
   int*  lbeg  = l.start;

   for(int i = l.firstUpdate - 1; i >= 0; --i)
   {
      int k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(int j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   for(int i = thedim - 1; i >= 0; --i)
   {
      int  r = l.rorig[i];
      R x = vec[r];

      if(x != 0.0)
      {
         for(int k = l.rbeg[r]; k < l.rbeg[r + 1]; k++)
         {
            int j = l.ridx[k];

            assert(l.rperm[j] < i);

            vec[j] -= x * l.rval[k];
         }
      }
   }

#endif // SOPLEX_WITH_L_ROWS
}